

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Helpers.cpp
# Opt level: O0

void GetBinaryPathWithFileNameA(char *path,size_t buffer_size,char *filename)

{
  size_t local_350;
  size_t len;
  char modulename [260];
  char local_238 [8];
  char dir [256];
  char local_12b [3];
  char local_128 [5];
  char drive [3];
  char fullpath [260];
  char *filename_local;
  size_t buffer_size_local;
  char *path_local;
  
  PlatformAgnostic::SystemInfo::GetBinaryLocation((char *)&len,0x104);
  _splitpath_s((char *)&len,local_12b,3,local_238,0x100,(char *)0x0,0,(char *)0x0,0);
  _makepath_s<260ul>((char (*) [260])local_128,local_12b,local_238,filename,(char *)0x0);
  local_350 = strlen(local_128);
  if (local_350 < buffer_size) {
    memcpy(path,local_128,local_350);
  }
  else {
    local_350 = 0;
  }
  path[local_350] = '\0';
  return;
}

Assistant:

void GetBinaryPathWithFileNameA(char *path, const size_t buffer_size, const char* filename)
{
    char fullpath[_MAX_PATH];
    char drive[_MAX_DRIVE];
    char dir[_MAX_DIR];

    char modulename[_MAX_PATH];
    PlatformAgnostic::SystemInfo::GetBinaryLocation(modulename, _MAX_PATH);
    _splitpath_s(modulename, drive, _MAX_DRIVE, dir, _MAX_DIR, nullptr, 0, nullptr, 0);
    _makepath_s(fullpath, drive, dir, filename, nullptr);

    size_t len = strlen(fullpath);
    if (len < buffer_size)
    {
        memcpy(path, fullpath, len * sizeof(char));
    }
    else
    {
        len = 0;
    }
    path[len] = char(0);
}